

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O3

int32_t icu_63::anon_unknown_8::binarySearch(int64_t *list,int32_t limit,int64_t ce)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (limit == 0) {
    return -1;
  }
  uVar1 = limit / 2;
  uVar3 = list[(int)uVar1];
  if (uVar3 != ce) {
    uVar2 = 0;
    do {
      if ((ulong)ce < uVar3) {
        limit = uVar1;
        if (uVar1 == uVar2) {
          return ~uVar1;
        }
      }
      else {
        bVar4 = uVar1 == uVar2;
        uVar2 = uVar1;
        if (bVar4) {
          return -2 - uVar1;
        }
      }
      uVar1 = (int)(limit + uVar2) / 2;
      uVar3 = list[(int)uVar1];
    } while (uVar3 != ce);
  }
  return uVar1;
}

Assistant:

int32_t
binarySearch(const int64_t list[], int32_t limit, int64_t ce) {
    if (limit == 0) { return ~0; }
    int32_t start = 0;
    for (;;) {
        int32_t i = (start + limit) / 2;
        int32_t cmp = compareInt64AsUnsigned(ce, list[i]);
        if (cmp == 0) {
            return i;
        } else if (cmp < 0) {
            if (i == start) {
                return ~start;  // insert ce before i
            }
            limit = i;
        } else {
            if (i == start) {
                return ~(start + 1);  // insert ce after i
            }
            start = i;
        }
    }
}